

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallHeapBlockAllocator.cpp
# Opt level: O0

void __thiscall
Memory::SmallHeapBlockAllocator<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>_>::
Clear(SmallHeapBlockAllocator<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>_> *this)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  undefined4 *puVar5;
  Recycler *pRVar6;
  SmallHeapBlockT<MediumAllocationBlockAttributes> *pSVar7;
  SmallLeafHeapBlockT<MediumAllocationBlockAttributes> *smallBlock;
  HeapBlock *heapBlockVerify;
  FreeObject *freeObject;
  FreeObject *pFStack_20;
  uint lastFreeCount;
  FreeObject *remainingFreeObjectList;
  SmallLeafHeapBlockT<MediumAllocationBlockAttributes> *heapBlock;
  SmallHeapBlockAllocator<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>_> *this_local
  ;
  
  pSVar7 = &this->heapBlock->super_SmallHeapBlockT<MediumAllocationBlockAttributes>;
  if (pSVar7 == (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
    if (this->freeObjectList != (FreeObject *)0x0) {
      for (heapBlockVerify = (HeapBlock *)this->freeObjectList; heapBlockVerify != (HeapBlock *)0x0;
          heapBlockVerify = (HeapBlock *)FreeObject::GetNext((FreeObject *)heapBlockVerify)) {
        pRVar6 = HeapBucket::GetRecycler(this->bucket);
        pSVar7 = (SmallHeapBlockT<MediumAllocationBlockAttributes> *)
                 Recycler::FindHeapBlock(pRVar6,heapBlockVerify);
        if (pSVar7 == (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.cpp"
                             ,0x83,"(heapBlockVerify != nullptr)","heapBlockVerify != nullptr");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 0;
        }
        bVar2 = HeapBlock::IsLargeHeapBlock((HeapBlock *)pSVar7);
        if (bVar2) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.cpp"
                             ,0x84,"(!heapBlockVerify->IsLargeHeapBlock())",
                             "!heapBlockVerify->IsLargeHeapBlock()");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 0;
        }
        SmallHeapBlockT<MediumAllocationBlockAttributes>::ClearExplicitFreeBitForObject
                  (pSVar7,heapBlockVerify);
      }
      this->freeObjectList = (FreeObject *)0x0;
    }
  }
  else {
    if ((pSVar7->isInAllocator & 1U) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.cpp"
                         ,0x3c,"(heapBlock->isInAllocator)","heapBlock->isInAllocator");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    pSVar7->isInAllocator = false;
    pFStack_20 = (FreeObject *)0x0;
    if (this->endAddress == (char *)0x0) {
      pFStack_20 = this->freeObjectList;
      pSVar7->freeObjectList = pFStack_20;
    }
    else {
      TrackNativeAllocatedObjects(this);
      this->lastNonNativeBumpAllocatedBlock = (char *)0x0;
      Recycler::TrackUnallocated
                (this->bucket->heapInfo->recycler,(char *)this->freeObjectList,this->endAddress,
                 (ulong)this->bucket->sizeCat);
      RecyclerMemoryTracking::ReportUnallocated
                (((this->heapBlock->super_SmallHeapBlockT<MediumAllocationBlockAttributes>).
                 heapBucket)->heapInfo->recycler,this->freeObjectList,this->endAddress,
                 (ulong)pSVar7->heapBucket->sizeCat);
      if (pSVar7->freeObjectList != (FreeObject *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.cpp"
                           ,0x54,"(heapBlock->freeObjectList == nullptr)",
                           "heapBlock->freeObjectList == nullptr");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      this->endAddress = (char *)0x0;
    }
    this->freeObjectList = (FreeObject *)0x0;
    if (pFStack_20 == (FreeObject *)0x0) {
      uVar3 = SmallHeapBlockT<MediumAllocationBlockAttributes>::GetAndClearLastFreeCount(pSVar7);
      uVar4 = SmallHeapBlockT<MediumAllocationBlockAttributes>::GetObjectSize(pSVar7);
      pRVar6 = pSVar7->heapBucket->heapInfo->recycler;
      (pRVar6->autoHeap).uncollectedAllocBytes =
           (ulong)(uVar3 * uVar4) + (pRVar6->autoHeap).uncollectedAllocBytes;
      if (pSVar7->lastUncollectedAllocBytes != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.cpp"
                           ,0x6f,"(heapBlock->lastUncollectedAllocBytes == 0)",
                           "heapBlock->lastUncollectedAllocBytes == 0");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      uVar4 = SmallHeapBlockT<MediumAllocationBlockAttributes>::GetObjectSize(pSVar7);
      pSVar7->lastUncollectedAllocBytes = uVar3 * uVar4;
    }
    else {
      SmallHeapBlockT<MediumAllocationBlockAttributes>::SetIsClearedFromAllocator(pSVar7,true);
    }
    this->heapBlock = (SmallLeafHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
    SmallHeapBlockT<MediumAllocationBlockAttributes>::CheckDebugFreeBitVector(pSVar7,false);
  }
  return;
}

Assistant:

void
SmallHeapBlockAllocator<TBlockType>::Clear()
{
    TBlockType * heapBlock = this->heapBlock;
    if (heapBlock != nullptr)
    {
        Assert(heapBlock->isInAllocator);
        heapBlock->isInAllocator = false;
        FreeObject * remainingFreeObjectList = nullptr;
        if (this->endAddress != nullptr)
        {
#ifdef RECYCLER_TRACK_NATIVE_ALLOCATED_OBJECTS
            TrackNativeAllocatedObjects();
            lastNonNativeBumpAllocatedBlock = nullptr;
#endif
#ifdef PROFILE_RECYCLER_ALLOC
            // Need to tell the tracker
            this->bucket->heapInfo->recycler->TrackUnallocated((char *)this->freeObjectList, this->endAddress, this->bucket->sizeCat);
#endif
            RecyclerMemoryTracking::ReportUnallocated(this->heapBlock->heapBucket->heapInfo->recycler, (char *)this->freeObjectList, this->endAddress, heapBlock->heapBucket->sizeCat);
#ifdef RECYCLER_PERF_COUNTERS
            size_t unallocatedObjects = heapBlock->objectCount - ((char *)this->freeObjectList - heapBlock->address) / heapBlock->objectSize;
            size_t unallocatedObjectBytes = unallocatedObjects * heapBlock->GetObjectSize();
            RECYCLER_PERF_COUNTER_ADD(LiveObject, unallocatedObjects);
            RECYCLER_PERF_COUNTER_ADD(LiveObjectSize, unallocatedObjectBytes);
            RECYCLER_PERF_COUNTER_SUB(FreeObjectSize, unallocatedObjectBytes);
            RECYCLER_PERF_COUNTER_ADD(SmallHeapBlockLiveObject, unallocatedObjects);
            RECYCLER_PERF_COUNTER_ADD(SmallHeapBlockLiveObjectSize, unallocatedObjectBytes);
            RECYCLER_PERF_COUNTER_SUB(SmallHeapBlockFreeObjectSize, unallocatedObjectBytes);
#endif
            Assert(heapBlock->freeObjectList == nullptr);
            this->endAddress = nullptr;
        }
        else
        {
            remainingFreeObjectList = this->freeObjectList;
            heapBlock->freeObjectList = remainingFreeObjectList;
        }
        this->freeObjectList = nullptr;

        // this->freeObjectList and this->lastFreeCount are accessed in SmallHeapBlock::ResetMarks
        // the order of access there is first we see if lastFreeCount = 0, and if it is, we assert
        // that freeObjectList = null. Because of ARM's memory model, we need to insert barriers
        // so that the two variables can be accessed correctly across threads. Here, after we write
        // to this->freeObjectList, we insert a write barrier so that if this->lastFreeCount is 0,
        // this->freeObjectList must have been set to null. On the other end, we stick a read barrier
        // We use the MemoryBarrier macro because of ARMs lack of a separate read barrier
#if defined(_M_ARM32_OR_ARM64)
#if DBG
        MemoryBarrier();
#endif
#endif

        if (remainingFreeObjectList == nullptr)
        {
            uint lastFreeCount = heapBlock->GetAndClearLastFreeCount();
            heapBlock->heapBucket->heapInfo->recycler->autoHeap.uncollectedAllocBytes += lastFreeCount * heapBlock->GetObjectSize();
            Assert(heapBlock->lastUncollectedAllocBytes == 0);
            DebugOnly(heapBlock->lastUncollectedAllocBytes = lastFreeCount * heapBlock->GetObjectSize());
        }
        else
        {
            DebugOnly(heapBlock->SetIsClearedFromAllocator(true));
        }
        this->heapBlock = nullptr;

        RECYCLER_SLOW_CHECK(heapBlock->CheckDebugFreeBitVector(false));
    }
    else if (this->freeObjectList != nullptr)
    {
        // Explicit Free Object List
#ifdef RECYCLER_MEMORY_VERIFY
        FreeObject* freeObject = this->freeObjectList;

        while (freeObject)
        {
            HeapBlock* heapBlockVerify = this->bucket->GetRecycler()->FindHeapBlock((void*) freeObject);
            Assert(heapBlockVerify != nullptr);
            Assert(!heapBlockVerify->IsLargeHeapBlock());
            TBlockType* smallBlock = (TBlockType*)heapBlockVerify;

            smallBlock->ClearExplicitFreeBitForObject((void*) freeObject);
            freeObject = freeObject->GetNext();
        }
#endif
        this->freeObjectList = nullptr;
    }
#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP 
    DebugOnly(this->isAllocatingFromNewBlock = false);
#endif
}